

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

Phase __thiscall Js::Phases::GetFirstPhase(Phases *this)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (((UnitPhase *)&this->phaseList[0].valid)->valid != false) goto LAB_00352a38;
    lVar1 = lVar1 + 1;
    this = (Phases *)((long)this + 0x20);
  } while (lVar1 != 0x175);
  lVar1 = 0x176;
LAB_00352a38:
  return (Phase)lVar1;
}

Assistant:

Phase
    Phases::GetFirstPhase()
    {
        int i= -1;
        while(!this->phaseList[++i].valid)
        {
            if(i >= PhaseCount - 1)
            {
                return InvalidPhase;
            }
        }
        return Phase(i);
    }